

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::SC
          (AbstractContentContext *this,double *inColorComponents,int inColorComponentsLength)

{
  EStatusCode EVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_49;
  string local_48;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  uVar2 = 0;
  uVar3 = (ulong)(uint)inColorComponentsLength;
  if (inColorComponentsLength < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    PrimitiveObjectsWriter::WriteDouble
              (&this->mPrimitiveWriter,inColorComponents[uVar2],eTokenSeparatorSpace);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"SC",&local_49);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::SC(double* inColorComponents, int inColorComponentsLength)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	for(int i=0;i<inColorComponentsLength;++i)
		mPrimitiveWriter.WriteDouble(inColorComponents[i]);
	mPrimitiveWriter.WriteKeyword("SC");
	return GetCurrentStatusCode();
}